

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O0

void __thiscall LargeGapGrayCode::printStatisticsHeader(LargeGapGrayCode *this)

{
  _Setw _Var1;
  ostream *poVar2;
  LargeGapGrayCode *this_local;
  
  _Var1 = std::setw(5);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = std::operator<<(poVar2,"n");
  _Var1 = std::setw(0xc);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,"Method");
  _Var1 = std::setw(0xc);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,"MinGap");
  _Var1 = std::setw(0xc);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,"MaxGap");
  _Var1 = std::setw(0xc);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,"MinCount");
  _Var1 = std::setw(0xc);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,"MaxCount");
  _Var1 = std::setw(0xe);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,"GapVariance");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "------------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void LargeGapGrayCode::printStatisticsHeader()
{
	std::cout 	<< std::setw(5) << "n"
			<< std::setw(12) << "Method"
			<< std::setw(12) << "MinGap"
			<< std::setw(12) << "MaxGap"
			<< std::setw(12) << "MinCount"
			<< std::setw(12) << "MaxCount"
			<< std::setw(14) << "GapVariance" << std::endl;
	std::cout << "------------------------------------------------------------------------------------" << std::endl;
}